

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O0

void tommy_hashlin_foreach_arg(tommy_hashlin *hashlin,tommy_foreach_arg_func *func,void *arg)

{
  undefined8 *puVar1;
  tommy_count_t tVar2;
  tommy_count_t tVar3;
  long lVar4;
  tommy_hashlin_node **pptVar5;
  long in_FS_OFFSET;
  void *data;
  tommy_hashlin_node *node;
  tommy_count_t pos;
  tommy_count_t bucket_max;
  void *arg_local;
  tommy_foreach_arg_func *func_local;
  tommy_hashlin *hashlin_local;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  tVar2 = hashlin->low_max;
  tVar3 = hashlin->split;
  for (node._0_4_ = 0; (uint)node < tVar2 + tVar3; node._0_4_ = (uint)node + 1) {
    pptVar5 = tommy_hashlin_pos(hashlin,(uint)node);
    data = *pptVar5;
    while (data != (void *)0x0) {
      puVar1 = (undefined8 *)((long)data + 0x10);
      data = *data;
      (*func)(arg,(void *)*puVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashlin_foreach_arg(tommy_hashlin* hashlin, tommy_foreach_arg_func* func, void* arg)
{
	tommy_count_t bucket_max;
	tommy_count_t pos;

	/* number of valid buckets */
	bucket_max = hashlin->low_max + hashlin->split;

	for (pos = 0; pos < bucket_max; ++pos) {
		tommy_hashlin_node* node = *tommy_hashlin_pos(hashlin, pos);

		while (node) {
			void* data = node->data;
			node = node->next;
			func(arg, data);
		}
	}
}